

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

size_t wallet::wallet_tests::CalculateNestedKeyhashInputSize(bool use_max_sig)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  bool bVar3;
  CScript *pCVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar5;
  BaseSignatureCreator **ppBVar6;
  size_t sVar7;
  long in_FS_OFFSET;
  CKey key;
  CTxIn tx_in;
  SignatureData sig_data;
  FillableSigningProvider keystore;
  CScript script_pubkey;
  uint160 script_id;
  CScript inner_script;
  uint160 key_hash;
  CPubKey pubkey;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81(&key,0));
  CKey::GetPubKey(&pubkey,&key);
  Hash160<CPubKey>(&key_hash,&pubkey);
  sig_data.scriptSig.super_CScriptBase._union._8_8_ = 0;
  sig_data.scriptSig.super_CScriptBase._union._16_8_ = 0;
  sig_data.complete = false;
  sig_data.witness = false;
  sig_data._2_6_ = 0;
  sig_data.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  pCVar4 = CScript::operator<<((CScript *)&sig_data,OP_0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&keystore,(uchar *)&key_hash,
             pubkey.vch,(allocator_type *)&tx_in);
  ppVar5 = &CScript::operator<<(pCVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &keystore)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&inner_script.super_CScriptBase,ppVar5);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&keystore);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&sig_data);
  Hash160<CScript>(&script_id,&inner_script);
  sig_data.scriptSig.super_CScriptBase._union._8_8_ = 0;
  sig_data.scriptSig.super_CScriptBase._union._16_8_ = 0;
  sig_data.complete = false;
  sig_data.witness = false;
  sig_data._2_6_ = 0;
  sig_data.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  pCVar4 = CScript::operator<<((CScript *)&sig_data,OP_HASH160);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&keystore,(uchar *)&script_id,
             (uchar *)&inner_script,(allocator_type *)&tx_in);
  pCVar4 = CScript::operator<<(pCVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &keystore);
  ppVar5 = &CScript::operator<<(pCVar4,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&script_pubkey.super_CScriptBase,ppVar5);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&keystore);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&sig_data);
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_01158ee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FillableSigningProvider::AddCScript(&keystore,&inner_script);
  FillableSigningProvider::AddKeyPubKey(&keystore,&key,&pubkey);
  sig_data._0_8_ = sig_data._0_8_ & 0xffffffffffff0000;
  p_Var1 = &sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&sig_data.scriptSig,0,0xb8);
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sig_data.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sig_data.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  sig_data.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  sig_data.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sig_data.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sig_data.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sig_data.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (use_max_sig) {
    ppBVar6 = &DUMMY_MAXIMUM_SIGNATURE_CREATOR;
  }
  else {
    ppBVar6 = &DUMMY_SIGNATURE_CREATOR;
  }
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = ProduceSignature(&keystore.super_SigningProvider,*ppBVar6,&script_pubkey,&sig_data);
  if (bVar3) {
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    tx_in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    tx_in.prevout.n = 0xffffffff;
    tx_in.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    tx_in.scriptSig.super_CScriptBase._union._8_8_ = 0;
    tx_in.scriptSig.super_CScriptBase._union._16_8_ = 0;
    tx_in.scriptSig.super_CScriptBase._24_8_ = 0;
    tx_in.scriptWitness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tx_in.scriptWitness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tx_in.scriptWitness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tx_in.nSequence = 0xffffffff;
    UpdateInput(&tx_in,&sig_data);
    sVar7 = GetVirtualTransactionInputSize(&tx_in,0,0);
    CTxIn::~CTxIn(&tx_in);
    SignatureData::~SignatureData(&sig_data);
    FillableSigningProvider::~FillableSigningProvider(&keystore);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script_pubkey.super_CScriptBase);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&inner_script.super_CScriptBase);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&key.keydata);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return sVar7;
    }
    __stack_chk_fail();
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                ,0x300,"size_t wallet::wallet_tests::CalculateNestedKeyhashInputSize(bool)");
}

Assistant:

static size_t CalculateNestedKeyhashInputSize(bool use_max_sig)
{
    // Generate ephemeral valid pubkey
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();

    // Generate pubkey hash
    uint160 key_hash(Hash160(pubkey));

    // Create inner-script to enter into keystore. Key hash can't be 0...
    CScript inner_script = CScript() << OP_0 << std::vector<unsigned char>(key_hash.begin(), key_hash.end());

    // Create outer P2SH script for the output
    uint160 script_id(Hash160(inner_script));
    CScript script_pubkey = CScript() << OP_HASH160 << std::vector<unsigned char>(script_id.begin(), script_id.end()) << OP_EQUAL;

    // Add inner-script to key store and key to watchonly
    FillableSigningProvider keystore;
    keystore.AddCScript(inner_script);
    keystore.AddKeyPubKey(key, pubkey);

    // Fill in dummy signatures for fee calculation.
    SignatureData sig_data;

    if (!ProduceSignature(keystore, use_max_sig ? DUMMY_MAXIMUM_SIGNATURE_CREATOR : DUMMY_SIGNATURE_CREATOR, script_pubkey, sig_data)) {
        // We're hand-feeding it correct arguments; shouldn't happen
        assert(false);
    }

    CTxIn tx_in;
    UpdateInput(tx_in, sig_data);
    return (size_t)GetVirtualTransactionInputSize(tx_in);
}